

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.h
# Opt level: O0

bool __thiscall
FIX::TimeRange::isInSameRange(TimeRange *this,UtcTimeStamp *time1,UtcTimeStamp *time2)

{
  time_t tVar1;
  DateTime local_c8;
  DateTime local_b0;
  DateTime local_98;
  DateTime local_80;
  undefined1 local_58 [8];
  LocalTimeStamp localTime2;
  LocalTimeStamp localTime1;
  UtcTimeStamp *time2_local;
  UtcTimeStamp *time1_local;
  TimeRange *this_local;
  
  if (((byte)this[0x38] & 1) == 0) {
    DateTime::DateTime(&local_b0,&time1->super_DateTime);
    DateTime::DateTime(&local_c8,&time2->super_DateTime);
    this_local._7_1_ = isInSameRange(this,&local_b0,&local_c8);
    DateTime::~DateTime(&local_c8);
    DateTime::~DateTime(&local_b0);
  }
  else {
    tVar1 = DateTime::getTimeT(&time1->super_DateTime);
    LocalTimeStamp::LocalTimeStamp((LocalTimeStamp *)&localTime2.super_DateTime.m_time,tVar1,0);
    tVar1 = DateTime::getTimeT(&time2->super_DateTime);
    LocalTimeStamp::LocalTimeStamp((LocalTimeStamp *)local_58,tVar1,0);
    DateTime::DateTime(&local_80,(DateTime *)&localTime2.super_DateTime.m_time);
    DateTime::DateTime(&local_98,(DateTime *)local_58);
    this_local._7_1_ = isInSameRange(this,&local_80,&local_98);
    DateTime::~DateTime(&local_98);
    DateTime::~DateTime(&local_80);
    LocalTimeStamp::~LocalTimeStamp((LocalTimeStamp *)local_58);
    LocalTimeStamp::~LocalTimeStamp((LocalTimeStamp *)&localTime2.super_DateTime.m_time);
  }
  return this_local._7_1_;
}

Assistant:

bool isInSameRange( const UtcTimeStamp& time1, const UtcTimeStamp& time2 )
  {
    if( m_useLocalTime )
    {
      LocalTimeStamp localTime1( time1.getTimeT() );
      LocalTimeStamp localTime2( time2.getTimeT() );
      return isInSameRange( (DateTime)localTime1, (DateTime)localTime2 );
    }

    return isInSameRange( (DateTime)time1, (DateTime)time2 );
  }